

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *type)

{
  uint64_t uVar1;
  Reader structType;
  Reader local_48;
  
  if ((type->_reader).dataSize < 0x10) {
    return;
  }
  switch(*(type->_reader).data) {
  case 0xe:
    local_48._reader.segment = (type->_reader).segment;
    local_48._reader.capTable = (type->_reader).capTable;
    local_48._reader.data = (type->_reader).data;
    local_48._reader.pointers = (type->_reader).pointers;
    local_48._reader.dataSize = (type->_reader).dataSize;
    local_48._reader.pointerCount = (type->_reader).pointerCount;
    local_48._reader._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
    local_48._reader.nestingLimit = (type->_reader).nestingLimit;
    local_48._reader._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
    capnp::schema::Type::List::Reader::getElementType((Reader *)&structType,&local_48);
    validate(this,(Reader *)&structType);
    return;
  case 0xf:
    structType._reader.segment = (type->_reader).segment;
    structType._reader.capTable = (type->_reader).capTable;
    structType._reader.data = (type->_reader).data;
    structType._reader.pointers = (type->_reader).pointers;
    structType._reader.dataSize = (type->_reader).dataSize;
    structType._reader.pointerCount = (type->_reader).pointerCount;
    structType._reader._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
    structType._reader.nestingLimit = (type->_reader).nestingLimit;
    structType._reader._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
    if (structType._reader.dataSize < 0x80) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(uint64_t *)((long)structType._reader.data + 8);
    }
    validateTypeId(this,uVar1,ENUM);
    capnp::schema::Type::Enum::Reader::getBrand((Reader *)&local_48,(Reader *)&structType);
    break;
  case 0x10:
    structType._reader.segment = (type->_reader).segment;
    structType._reader.capTable = (type->_reader).capTable;
    structType._reader.data = (type->_reader).data;
    structType._reader.pointers = (type->_reader).pointers;
    structType._reader.dataSize = (type->_reader).dataSize;
    structType._reader.pointerCount = (type->_reader).pointerCount;
    structType._reader._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
    structType._reader.nestingLimit = (type->_reader).nestingLimit;
    structType._reader._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
    if (structType._reader.dataSize < 0x80) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(uint64_t *)((long)structType._reader.data + 8);
    }
    validateTypeId(this,uVar1,STRUCT);
    capnp::schema::Type::Struct::Reader::getBrand((Reader *)&local_48,&structType);
    break;
  case 0x11:
    structType._reader.segment = (type->_reader).segment;
    structType._reader.capTable = (type->_reader).capTable;
    structType._reader.data = (type->_reader).data;
    structType._reader.pointers = (type->_reader).pointers;
    structType._reader.dataSize = (type->_reader).dataSize;
    structType._reader.pointerCount = (type->_reader).pointerCount;
    structType._reader._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
    structType._reader.nestingLimit = (type->_reader).nestingLimit;
    structType._reader._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
    if (structType._reader.dataSize < 0x80) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(uint64_t *)((long)structType._reader.data + 8);
    }
    validateTypeId(this,uVar1,INTERFACE);
    capnp::schema::Type::Interface::Reader::getBrand((Reader *)&local_48,(Reader *)&structType);
    break;
  default:
    goto switchD_0016a839_default;
  }
  validate(this,(Reader *)&local_48);
switchD_0016a839_default:
  return;
}

Assistant:

inline T StructReader::getDataField(StructDataOffset offset) const {
  if ((offset + ONE * ELEMENTS) * capnp::bitsPerElement<T>() <= dataSize) {
    return reinterpret_cast<const WireValue<T>*>(data)[unbound(offset / ELEMENTS)].get();
  } else {
    return static_cast<T>(0);
  }
}